

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

void cvRescale(CVodeMem cv_mem)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  sunrealtype *psVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  sunrealtype sVar10;
  double dVar11;
  
  psVar4 = cv_mem->cv_cvals;
  *psVar4 = cv_mem->cv_eta;
  uVar1 = cv_mem->cv_q;
  if (0 < (int)uVar1) {
    sVar10 = *psVar4;
    lVar5 = 1;
    do {
      sVar10 = sVar10 * cv_mem->cv_eta;
      psVar4[lVar5] = sVar10;
      lVar5 = lVar5 + 1;
    } while ((ulong)uVar1 + 1 != lVar5);
  }
  N_VScaleVectorArray((ulong)uVar1,psVar4,cv_mem->cv_zn + 1);
  if (cv_mem->cv_quadr != 0) {
    N_VScaleVectorArray(cv_mem->cv_q,cv_mem->cv_cvals,cv_mem->cv_znQ + 1);
  }
  iVar2 = cv_mem->cv_sensi;
  if ((iVar2 != 0) || (cv_mem->cv_quadr_sensi != 0)) {
    uVar1 = cv_mem->cv_Ns;
    if (0 < (int)uVar1) {
      psVar4 = cv_mem->cv_cvals;
      uVar6 = 0;
      do {
        psVar4[uVar6] = cv_mem->cv_eta;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
    }
    uVar3 = cv_mem->cv_q;
    if (0 < (int)uVar3) {
      lVar7 = (long)(int)uVar1 * 8;
      lVar8 = 1;
      lVar9 = 0;
      lVar5 = lVar7;
      do {
        if (0 < (int)uVar1) {
          psVar4 = cv_mem->cv_cvals;
          uVar6 = 0;
          do {
            *(double *)((long)psVar4 + uVar6 * 8 + lVar5) =
                 cv_mem->cv_eta * *(double *)((long)psVar4 + uVar6 * 8 + lVar9);
            uVar6 = uVar6 + 1;
          } while (uVar1 != uVar6);
        }
        lVar8 = lVar8 + 1;
        lVar5 = lVar5 + lVar7;
        lVar9 = lVar9 + lVar7;
      } while (lVar8 != (ulong)uVar3 + 1);
    }
  }
  if (iVar2 != 0) {
    uVar1 = cv_mem->cv_q;
    if (0 < (int)uVar1) {
      uVar3 = cv_mem->cv_Ns;
      lVar5 = 1;
      lVar7 = 0;
      do {
        if (0 < (int)uVar3) {
          uVar6 = 0;
          do {
            *(N_Vector *)((long)cv_mem->cv_Xvecs + uVar6 * 8 + lVar7) = cv_mem->cv_znS[lVar5][uVar6]
            ;
            uVar6 = uVar6 + 1;
          } while (uVar3 != uVar6);
        }
        lVar5 = lVar5 + 1;
        lVar7 = lVar7 + (long)(int)uVar3 * 8;
      } while (lVar5 != (ulong)uVar1 + 1);
    }
    N_VScaleVectorArray(uVar1 * cv_mem->cv_Ns,cv_mem->cv_cvals,cv_mem->cv_Xvecs);
  }
  if (cv_mem->cv_quadr_sensi != 0) {
    uVar1 = cv_mem->cv_q;
    if (0 < (int)uVar1) {
      uVar3 = cv_mem->cv_Ns;
      lVar5 = 1;
      lVar7 = 0;
      do {
        if (0 < (int)uVar3) {
          uVar6 = 0;
          do {
            *(N_Vector *)((long)cv_mem->cv_Xvecs + uVar6 * 8 + lVar7) =
                 cv_mem->cv_znQS[lVar5][uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar3 != uVar6);
        }
        lVar5 = lVar5 + 1;
        lVar7 = lVar7 + (long)(int)uVar3 * 8;
      } while (lVar5 != (ulong)uVar1 + 1);
    }
    N_VScaleVectorArray(uVar1 * cv_mem->cv_Ns,cv_mem->cv_cvals,cv_mem->cv_Xvecs);
  }
  dVar11 = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_h = dVar11;
  cv_mem->cv_next_h = dVar11;
  cv_mem->cv_hscale = dVar11;
  cv_mem->cv_nscon = 0;
  return;
}

Assistant:

void cvRescale(CVodeMem cv_mem)
{
  int j;
  int is;

  /* compute scaling factors */
  cv_mem->cv_cvals[0] = cv_mem->cv_eta;
  for (j = 1; j <= cv_mem->cv_q; j++)
  {
    cv_mem->cv_cvals[j] = cv_mem->cv_eta * cv_mem->cv_cvals[j - 1];
  }

  (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals, cv_mem->cv_zn + 1,
                            cv_mem->cv_zn + 1);

  if (cv_mem->cv_quadr)
  {
    (void)N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals,
                              cv_mem->cv_znQ + 1, cv_mem->cv_znQ + 1);
  }

  /* compute sensi scaling factors */
  if (cv_mem->cv_sensi || cv_mem->cv_quadr_sensi)
  {
    for (is = 0; is < cv_mem->cv_Ns; is++)
    {
      cv_mem->cv_cvals[is] = cv_mem->cv_eta;
    }
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_cvals[j * cv_mem->cv_Ns + is] =
          cv_mem->cv_eta * cv_mem->cv_cvals[(j - 1) * cv_mem->cv_Ns + is];
      }
    }
  }

  if (cv_mem->cv_sensi)
  {
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_Xvecs[(j - 1) * cv_mem->cv_Ns + is] = cv_mem->cv_znS[j][is];
      }
    }

    (void)N_VScaleVectorArray(cv_mem->cv_q * cv_mem->cv_Ns, cv_mem->cv_cvals,
                              cv_mem->cv_Xvecs, cv_mem->cv_Xvecs);
  }

  if (cv_mem->cv_quadr_sensi)
  {
    for (j = 1; j <= cv_mem->cv_q; j++)
    {
      for (is = 0; is < cv_mem->cv_Ns; is++)
      {
        cv_mem->cv_Xvecs[(j - 1) * cv_mem->cv_Ns + is] = cv_mem->cv_znQS[j][is];
      }
    }

    (void)N_VScaleVectorArray(cv_mem->cv_q * cv_mem->cv_Ns, cv_mem->cv_cvals,
                              cv_mem->cv_Xvecs, cv_mem->cv_Xvecs);
  }

  cv_mem->cv_h      = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_nscon  = 0;
}